

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::initStyleOption(QToolBar *this,QStyleOptionToolBar *option)

{
  long lVar1;
  Orientation OVar2;
  undefined4 uVar3;
  QToolBarPrivate *this_00;
  QStyle *pQVar4;
  QMainWindowLayout *this_01;
  QMainWindowLayout *option_00;
  long in_RSI;
  QToolBar *in_RDI;
  long in_FS_OFFSET;
  QMainWindowLayout *layout;
  QMainWindow *mainWindow;
  QToolBarPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  ToolBarFeature in_stack_ffffffffffffffbc;
  QToolBarLayout *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QToolBar *)0x6edb6f);
  if (in_RSI != 0) {
    QStyleOption::initFrom((QStyleOption *)this_00,in_stack_ffffffffffffffd0);
    OVar2 = orientation(in_RDI);
    if (OVar2 == Horizontal) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)(in_RSI + 8),State_Horizontal);
    }
    pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    uVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x34,0,in_RDI);
    *(undefined4 *)(in_RSI + 0x50) = uVar3;
    QToolBarLayout::movable(in_stack_ffffffffffffffc8);
    QFlags<QStyleOptionToolBar::ToolBarFeature>::QFlags
              ((QFlags<QStyleOptionToolBar::ToolBarFeature> *)in_RDI,in_stack_ffffffffffffffbc);
    *(undefined4 *)(in_RSI + 0x4c) = local_c;
    *(undefined4 *)(in_RSI + 0x48) = 0;
    QWidget::parentWidget((QWidget *)0x6edc2a);
    this_01 = (QMainWindowLayout *)qobject_cast<QMainWindow*>((QObject *)0x6edc32);
    if (this_01 != (QMainWindowLayout *)0x0) {
      option_00 = qt_mainwindow_layout((QMainWindow *)0x6edc4b);
      QMainWindowLayout::getStyleOptionInfo(this_01,(QStyleOptionToolBar *)option_00,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::initStyleOption(QStyleOptionToolBar *option) const
{
    Q_D(const QToolBar);

    if (!option)
        return;

    option->initFrom(this);
    if (orientation() == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    option->lineWidth = style()->pixelMetric(QStyle::PM_ToolBarFrameWidth, nullptr, this);
    option->features = d->layout->movable()
                        ? QStyleOptionToolBar::Movable
                        : QStyleOptionToolBar::None;
    // if the tool bar is not in a QMainWindow, this will make the painting right
    option->toolBarArea = Qt::NoToolBarArea;

    // Add more styleoptions if the toolbar has been added to a mainwindow.
    QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parentWidget());

    if (!mainWindow)
        return;

    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT_X(layout != nullptr, "QToolBar::initStyleOption()",
               "QMainWindow->layout() != QMainWindowLayout");

    layout->getStyleOptionInfo(option, const_cast<QToolBar *>(this));
}